

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

PaSampleFormat
PaUtil_SelectClosestAvailableFormat(PaSampleFormat availableFormats,PaSampleFormat format)

{
  ulong uVar1;
  ulong uVar2;
  PaSampleFormat PVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = format & 0xffffffff7fffffff;
  uVar5 = availableFormats & 0xffffffff7fffffff;
  if ((uVar5 & format) != 0) {
    return uVar4;
  }
  uVar2 = uVar4;
  if (uVar4 != 1) {
    do {
      uVar1 = uVar2;
      uVar2 = uVar1 >> 1;
      if (uVar1 < 2) break;
    } while ((uVar2 & uVar5) == 0);
    if (1 < uVar1) {
      return uVar2;
    }
  }
  do {
    uVar4 = uVar4 * 2;
    if (uVar4 == 0x10000) break;
  } while ((uVar4 & uVar5) == 0);
  PVar3 = 0xffffffffffffd8f6;
  if ((uVar4 & uVar5) != 0) {
    PVar3 = uVar4;
  }
  return PVar3;
}

Assistant:

PaSampleFormat PaUtil_SelectClosestAvailableFormat(
        PaSampleFormat availableFormats, PaSampleFormat format )
{
    PaSampleFormat result;

    format &= ~paNonInterleaved;
    availableFormats &= ~paNonInterleaved;
    
    if( (format & availableFormats) == 0 )
    {
        /* NOTE: this code depends on the sample format constants being in
            descending order of quality - ie best quality is 0
            FIXME: should write an assert which checks that all of the
            known constants conform to that requirement.
        */

        if( format != 0x01 )
        {
            /* scan for better formats */
            result = format;
            do
            {
                result >>= 1;
            }
            while( (result & availableFormats) == 0 && result != 0 );
        }
        else
        {
            result = 0;
        }
        
        if( result == 0 ){
            /* scan for worse formats */
            result = format;
            do
            {
                result <<= 1;
            }
            while( (result & availableFormats) == 0 && result != paCustomFormat );

            if( (result & availableFormats) == 0 )
                result = paSampleFormatNotSupported;
        }
        
    }else{
        result = format;
    }

    return result;
}